

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

IterateResult __thiscall gl4cts::GPUShaderFP64Test10::iterate(GPUShaderFP64Test10 *this)

{
  bool bVar1;
  NotSupportedError *this_00;
  char *description;
  bool bVar2;
  qpTestResult testResult;
  TestContext *this_01;
  functionEnum *pfVar3;
  pointer type;
  string local_48;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_gpu_shader_fp64");
  if (!bVar1) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"GL_ARB_gpu_shader_fp64 is not supported","");
    tcu::NotSupportedError::NotSupportedError(this_00,&local_48);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  testInit(this);
  type = (this->m_types).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
         ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_types).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
      ._M_impl.super__Vector_impl_data._M_finish != type) {
    bVar1 = true;
    bVar2 = true;
    do {
      pfVar3 = (this->m_functions).
               super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->m_functions).
          super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
          ._M_impl.super__Vector_impl_data._M_finish != pfVar3) {
        do {
          bVar2 = bVar1;
          bVar1 = test(this,*pfVar3,type);
          if (!bVar1) {
            bVar2 = false;
          }
          pfVar3 = pfVar3 + 1;
          bVar1 = bVar2;
        } while (pfVar3 != (this->m_functions).
                           super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      type = type + 1;
    } while ((this->m_types).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
             ._M_impl.super__Vector_impl_data._M_finish != type);
    if (!bVar2) {
      this_01 = ((this->super_TestCase).m_context)->m_testCtx;
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
      goto LAB_00955647;
    }
  }
  this_01 = ((this->super_TestCase).m_context)->m_testCtx;
  description = "Pass";
  testResult = QP_TEST_RESULT_PASS;
LAB_00955647:
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GPUShaderFP64Test10::iterate()
{
	bool result = true;

	/* Check if extension is supported */
	if (false == m_context.getContextInfo().isExtensionSupported("GL_ARB_gpu_shader_fp64"))
	{
		throw tcu::NotSupportedError("GL_ARB_gpu_shader_fp64 is not supported");
	}

	testInit();

	/* For each combination of function and type */
	for (std::vector<typeDetails>::const_iterator type = m_types.begin(); m_types.end() != type; ++type)
	{
		for (std::vector<functionEnum>::const_iterator function = m_functions.begin(); m_functions.end() != function;
			 ++function)
		{
			if (false == test(*function, *type))
			{
				result = false;
			}
		}
	}

	/* Set result */
	if (true == result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}